

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_uint128.cpp
# Opt level: O0

void __thiscall UInt128_FromBytes_Test::~UInt128_FromBytes_Test(UInt128_FromBytes_Test *this)

{
  UInt128_FromBytes_Test *this_local;
  
  ~UInt128_FromBytes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F (UInt128, FromBytes) {
    EXPECT_EQ (pstore::uint128 (0, 0), (pstore::uint128{std::array<std::uint8_t, 16>{
                                           {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xffffffffffffffff, 0xffffffffffffffff),
               (pstore::uint128{std::array<std::uint8_t, 16>{{0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
                                                              0xff, 0xff, 0xff, 0xff, 0xff, 0xff,
                                                              0xff, 0xff, 0xff, 0xff}}}));

    EXPECT_EQ (pstore::uint128 (0, 0xff),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff}}}));
    EXPECT_EQ (pstore::uint128 (0, 0xff00),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0}}}));
    EXPECT_EQ (pstore::uint128 (0, 0xff0000),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0, 0xff000000),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0, 0xff00000000),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0, 0xff0000000000),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0, 0xff000000000000),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0, 0xff00000000000000),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0, 0xff, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0, 0xff, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff00, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0, 0xff, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff0000, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0, 0xff, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff000000, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0, 0xff, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff00000000, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0, 0xff, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff0000000000, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0, 0xff, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff000000000000, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0, 0xff, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
    EXPECT_EQ (pstore::uint128 (0xff00000000000000, 0),
               (pstore::uint128{std::array<std::uint8_t, 16>{
                   {0xff, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0, 0}}}));
}